

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O2

void baryonyx::info<long_double,long_double,long_double>
               (context *ctx,char *fmt,longdouble *arg1,longdouble *args,longdouble *args_1)

{
  if (5 < (int)ctx->log_priority) {
    log<long_double,long_double,long_double>(_stdout,6,fmt,arg1,args,args_1);
    return;
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}